

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O1

int __thiscall llvm::StringMapImpl::FindKey(StringMapImpl *this,StringRef Key)

{
  uint uVar1;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  uint unaff_EBP;
  int iVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  sVar8 = Key.Length;
  uVar1 = this->NumBuckets;
  if ((ulong)uVar1 == 0) {
    unaff_EBP = 0xffffffff;
  }
  else {
    if (sVar8 == 0) {
      uVar11 = 0;
    }
    else {
      sVar7 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 * 0x21 + (uint)(byte)Key.Data[sVar7];
        sVar7 = sVar7 + 1;
      } while (sVar8 != sVar7);
    }
    uVar10 = uVar11 & uVar1 - 1;
    ppSVar3 = this->TheTable;
    uVar2 = this->ItemSize;
    iVar9 = 1;
    do {
      pSVar4 = ppSVar3[uVar10];
      if (pSVar4 == (StringMapEntryBase *)0x0) {
        uVar5 = 0xffffffff;
LAB_001a2613:
        unaff_EBP = uVar5;
        bVar12 = false;
      }
      else {
        if ((pSVar4 != (StringMapEntryBase *)0xfffffffffffffff8) &&
           (*(uint *)((long)ppSVar3 + (ulong)uVar10 * 4 + (ulong)uVar1 * 8 + 8) == uVar11)) {
          sVar7 = pSVar4->StrLen;
          if (sVar7 == sVar8) {
            if (sVar7 == 0) {
              bVar12 = true;
            }
            else {
              iVar6 = bcmp(Key.Data,(void *)((long)&pSVar4->StrLen + (ulong)uVar2),sVar7);
              bVar12 = iVar6 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          uVar5 = uVar10;
          if (bVar12) goto LAB_001a2613;
        }
        uVar10 = uVar10 + iVar9 & uVar1 - 1;
        iVar9 = iVar9 + 1;
        bVar12 = true;
      }
    } while (bVar12);
  }
  return unaff_EBP;
}

Assistant:

int StringMapImpl::FindKey(StringRef Key) const {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) return -1;  // Really empty table?
  unsigned FullHashValue = djbHash(Key, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return.
    if (LLVM_LIKELY(!BucketItem))
      return -1;

    if (BucketItem == getTombstoneVal()) {
      // Ignore tombstones.
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because NameStart isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Key == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}